

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable.hpp
# Opt level: O3

__pid_t __thiscall zmq::condition_variable_t::wait(condition_variable_t *this,void *__stat_loc)

{
  cv_status cVar1;
  __pid_t _Var2;
  long lVar3;
  int *piVar4;
  int in_EDX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  
  if (in_EDX == -1) {
    std::_V2::condition_variable_any::wait<zmq::mutex_t>(&this->_cv,(mutex_t *)__stat_loc);
    _Var2 = 0;
  }
  else {
    lVar3 = std::chrono::_V2::steady_clock::now();
    local_20.__d.__r = (duration)((long)in_EDX * 1000000 + lVar3);
    cVar1 = std::_V2::condition_variable_any::
            wait_until<zmq::mutex_t,std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (&this->_cv,(mutex_t *)__stat_loc,&local_20);
    _Var2 = 0;
    if (cVar1 == timeout) {
      piVar4 = __errno_location();
      *piVar4 = 0xb;
      _Var2 = -1;
    }
  }
  return _Var2;
}

Assistant:

int wait (mutex_t *mutex_, int timeout_)
    {
        // this assumes that the mutex mutex_ has been locked by the caller
        int res = 0;
        if (timeout_ == -1) {
            _cv.wait (
              *mutex_); // unlock mtx and wait cv.notify_all(), lock mtx after cv.notify_all()
        } else if (_cv.wait_for (*mutex_, std::chrono::milliseconds (timeout_))
                   == std::cv_status::timeout) {
            // time expired
            errno = EAGAIN;
            res = -1;
        }
        return res;
    }